

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::determineSubStruct
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
          *structure)

{
  pointer pMVar1;
  bool bVar2;
  __type_conflict _Var3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer pMVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
  local_e0;
  
  bVar2 = std::operator==(&((structure->second).members.
                            super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                            ._M_impl.super__Vector_impl_data._M_start)->name,"sType");
  if (!bVar2) {
    for (p_Var4 = (this->m_structs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->m_structs)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData,_true>
                (&local_e0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
                  *)(p_Var4 + 1));
      pMVar1 = local_e0.second.members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pMVar5 = (structure->second).members.
               super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_e0.second.members.
                        super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_e0.second.members.
                       super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                       ._M_impl.super__Vector_impl_data._M_start) <
          (ulong)((long)(structure->second).members.
                        super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar5)) {
        __rhs = &pMVar5->name;
        pMVar5 = local_e0.second.members.
                 super__Vector_base<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        while( true ) {
          if (pMVar5 == pMVar1) {
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
            ::~pair(&local_e0);
            std::__cxx11::string::string
                      ((string *)__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var4 + 1));
            return __return_storage_ptr__;
          }
          bVar2 = TypeInfo::operator==(&pMVar5->type,(TypeInfo *)(__rhs + -3));
          if ((!bVar2) || (_Var3 = std::operator==(&pMVar5->name,__rhs), !_Var3)) break;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&__rhs[0xc].field_2 + 8);
          pMVar5 = pMVar5 + 1;
        }
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::StructureData>
      ::~pair(&local_e0);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::determineSubStruct( std::pair<std::string, StructureData> const & structure ) const
{
  if ( structure.second.members.front().name != "sType" )
  {
    // check if sd is a substruct of structure
    auto isSubStruct = [&structure]( std::pair<std::string, StructureData> const & sd ) noexcept
    {
      // member-by-member comparison of type and name
      auto memberIt = structure.second.members.begin();
      auto isMember = [&memberIt]( MemberData const & md ) noexcept
      {
        if ( ( md.type == memberIt->type ) && ( md.name == memberIt->name ) )
        {
          ++memberIt;
          return true;
        }
        return false;
      };

      return ( sd.second.members.size() < structure.second.members.size() ) && std::ranges::all_of( sd.second.members, isMember );
    };

    // look for a struct in m_structs that starts identically to structure
    auto structIt = std::ranges::find_if( m_structs, isSubStruct );
    return ( structIt == m_structs.end() ) ? "" : structIt->first;
  }
  return "";
}